

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void do_fninit(CPUX86State *env)

{
  env->fpstt = 0;
  env->fpus = 0;
  env->fpuc = 0x37f;
  env->fpcs = 0;
  env->fpds = 0;
  env->fpip = 0;
  env->fpdp = 0;
  update_fp_status_x86_64(env);
  builtin_memcpy(env->fptags,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
  return;
}

Assistant:

static void do_fninit(CPUX86State *env)
{
    env->fpus = 0;
    env->fpstt = 0;
    env->fpcs = 0;
    env->fpds = 0;
    env->fpip = 0;
    env->fpdp = 0;
    cpu_set_fpuc(env, 0x37f);
    env->fptags[0] = 1;
    env->fptags[1] = 1;
    env->fptags[2] = 1;
    env->fptags[3] = 1;
    env->fptags[4] = 1;
    env->fptags[5] = 1;
    env->fptags[6] = 1;
    env->fptags[7] = 1;
}